

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O3

void __thiscall
Buffer_change_event_add_pagebreak_Test::TestBody(Buffer_change_event_add_pagebreak_Test *this)

{
  char *message;
  BufferWithReadonlyStrings local;
  AssertHelper local_e8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_e0;
  internal local_d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  BufferWithReadonlyStrings local_c8;
  
  anon_unknown.dwarf_1ffc5::BufferWithReadonlyStrings::BufferWithReadonlyStrings(&local_c8);
  bfy_buffer_set_changed_cb
            (&local_c8.buf,
             (anonymous_namespace)::BufferWithReadonlyStrings::start_listening_to_changes()::
             {lambda(auto:1*,auto:2_const*,void*)#1}::__invoke<bfy_buffer,bfy_changed_cb_info>,
             &local_c8.changes);
  bfy_buffer_add_pagebreak(&local_c8.buf);
  local_e8.data_._0_4_ = 0;
  local_e0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (((long)local_c8.changes.
               super__Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>._M_impl
               .super__Vector_impl_data._M_finish -
         (long)local_c8.changes.
               super__Vector_base<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>._M_impl
               .super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            (local_d8,"0","std::size(local.changes)",(int *)&local_e8,(unsigned_long *)&local_e0);
  if (local_d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e0);
    if (local_d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x59f,message);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    if (local_e0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_e0._M_head_impl + 8))();
    }
  }
  if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,local_d0);
  }
  anon_unknown.dwarf_1ffc5::BufferWithReadonlyStrings::~BufferWithReadonlyStrings(&local_c8);
  return;
}

Assistant:

TEST(Buffer, change_event_add_pagebreak) {
    BufferWithReadonlyStrings local;

    local.start_listening_to_changes();
    bfy_buffer_add_pagebreak(&local.buf);
    EXPECT_EQ(0, std::size(local.changes));
}